

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryManagerVk.cpp
# Opt level: O3

void __thiscall Diligent::QueryManagerVk::~QueryManagerVk(QueryManagerVk *this)

{
  long lVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  QUERY_TYPE QueryType;
  long lVar4;
  string _msg;
  stringstream QueryUsageSS;
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Vulkan query manager peak usage:",0x20);
  QueryType = QUERY_TYPE_OCCLUSION;
  lVar4 = 0xa8;
  do {
    if (*(long *)((long)(this->m_Pools)._M_elems + lVar4 + -0x18) != 0) {
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
      std::ostream::put((char)local_1a8);
      poVar2 = (ostream *)std::ostream::flush();
      lVar1 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x1e;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x20;
      __s = GetQueryTypeString(QueryType);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      lVar1 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      local_1f8._M_dataplus._M_p._0_1_ = 0x2f;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1f8,1);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 4;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    QueryType = QueryType + QUERY_TYPE_OCCLUSION;
    lVar4 = lVar4 + 0x80;
  } while (lVar4 != 0x328);
  std::__cxx11::stringbuf::str();
  FormatString<std::__cxx11::string>(&local_1f8,(Diligent *)local_1d8,Args);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)
              (0,CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
      &local_1f8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
                    local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  lVar4 = 0x288;
  do {
    QueryPoolInfo::~QueryPoolInfo((QueryPoolInfo *)((long)(this->m_Pools)._M_elems + lVar4 + -8));
    lVar4 = lVar4 + -0x80;
  } while (lVar4 != -0x78);
  return;
}

Assistant:

QueryManagerVk::~QueryManagerVk()
{
    std::stringstream QueryUsageSS;
    QueryUsageSS << "Vulkan query manager peak usage:";
    for (Uint32 QueryType = QUERY_TYPE_UNDEFINED + 1; QueryType < QUERY_TYPE_NUM_TYPES; ++QueryType)
    {
        auto& PoolInfo = m_Pools[QueryType];
        if (PoolInfo.IsNull())
            continue;

        QueryUsageSS << std::endl
                     << std::setw(30) << std::left << GetQueryTypeString(static_cast<QUERY_TYPE>(QueryType)) << ": "
                     << std::setw(4) << std::right << PoolInfo.GetMaxAllocatedQueries()
                     << '/' << std::setw(4) << PoolInfo.GetQueryCount();
    }
    LOG_INFO_MESSAGE(QueryUsageSS.str());
}